

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::setPage(QWizard *this,int theid,QWizardPage *page)

{
  PageMap *this_00;
  QWizardPrivate *this_01;
  long lVar1;
  bool bVar2;
  int iVar3;
  QWizardField *field;
  QWizardField *field_00;
  char *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  QObject local_70 [8];
  char local_68 [24];
  char *local_50;
  QWidget *local_48;
  _Rb_tree_color local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &page->super_QWidget;
  local_3c = theid;
  if (page == (QWizardPage *)0x0) {
    pcVar4 = "QWizard::setPage: Cannot insert null page";
  }
  else {
    if (theid != -1) {
      this_01 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
      this_00 = &this_01->pageMap;
      bVar2 = QMap<int,_QWizardPage_*>::contains(this_00,(int *)&local_3c);
      if (bVar2) {
        local_68[0] = '\x02';
        local_68[1] = '\0';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[0x14] = '\0';
        local_68[0x15] = '\0';
        local_68[0x16] = '\0';
        local_68[0x17] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68[0xc] = '\0';
        local_68[0xd] = '\0';
        local_68[0xe] = '\0';
        local_68[0xf] = '\0';
        local_68[0x10] = '\0';
        local_68[0x11] = '\0';
        local_68[0x12] = '\0';
        local_68[0x13] = '\0';
        local_50 = "default";
        QMessageLogger::warning
                  (local_68,"QWizard::setPage: Page with duplicate ID %d ignored",(ulong)local_3c);
      }
      else {
        QWidget::setParent(&page->super_QWidget,&this_01->pageFrame->super_QWidget);
        lVar1 = *(long *)&(page->super_QWidget).field_0x8;
        field_00 = *(QWizardField **)(lVar1 + 0x2f8);
        for (lVar5 = *(long *)(lVar1 + 0x300) << 7; lVar5 != 0; lVar5 = lVar5 + -0x80) {
          QWizardPrivate::addField(this_01,field_00);
          field_00 = field_00 + 1;
        }
        QList<QWizardField>::clear((QList<QWizardField> *)(lVar1 + 0x2f0));
        QObject::connect(local_70,(char *)page,(QObject *)"2completeChanged()",(char *)this,0x66ed5f
                        );
        QMetaObject::Connection::~Connection((Connection *)local_70);
        QMap<int,_QWizardPage_*>::insert(this_00,(int *)&local_3c,(QWizardPage **)&local_48);
        *(QWizard **)(*(long *)&local_48->field_0x8 + 600) = this;
        iVar3 = (**(code **)(*(long *)&(this_01->pageVBoxLayout->super_QBoxLayout).super_QLayout +
                            200))();
        bVar2 = QLayout::isEnabled((QLayout *)this_01->pageVBoxLayout);
        QLayout::setEnabled((QLayout *)this_01->pageVBoxLayout,false);
        QBoxLayout::insertWidget
                  (&this_01->pageVBoxLayout->super_QBoxLayout,iVar3 + -1,local_48,0,(Alignment)0x0);
        QWidget::hide(local_48);
        QLayout::setEnabled((QLayout *)this_01->pageVBoxLayout,bVar2);
        if ((this_01->startSetByUser == false) &&
           ((*(_Base_ptr *)
              ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
            )[1]._M_color == local_3c)) {
          this_01->start = local_3c;
        }
        pageAdded(this,local_3c);
      }
      goto LAB_004c3ce1;
    }
    pcVar4 = "QWizard::setPage: Cannot insert page with ID -1";
  }
  local_50 = "default";
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0] = '\x02';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  QMessageLogger::warning(local_68,pcVar4);
LAB_004c3ce1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setPage(int theid, QWizardPage *page)
{
    Q_D(QWizard);

    if (Q_UNLIKELY(!page)) {
        qWarning("QWizard::setPage: Cannot insert null page");
        return;
    }

    if (Q_UNLIKELY(theid == -1)) {
        qWarning("QWizard::setPage: Cannot insert page with ID -1");
        return;
    }

    if (Q_UNLIKELY(d->pageMap.contains(theid))) {
        qWarning("QWizard::setPage: Page with duplicate ID %d ignored", theid);
        return;
    }

    page->setParent(d->pageFrame);

    QList<QWizardField> &pendingFields = page->d_func()->pendingFields;
    for (const auto &field : std::as_const(pendingFields))
        d->addField(field);
    pendingFields.clear();

    connect(page, SIGNAL(completeChanged()), this, SLOT(_q_updateButtonStates()));

    d->pageMap.insert(theid, page);
    page->d_func()->wizard = this;

    int n = d->pageVBoxLayout->count();

    // disable layout to prevent layout updates while adding
    bool pageVBoxLayoutEnabled = d->pageVBoxLayout->isEnabled();
    d->pageVBoxLayout->setEnabled(false);

    d->pageVBoxLayout->insertWidget(n - 1, page);

    // hide new page and reset layout to old status
    page->hide();
    d->pageVBoxLayout->setEnabled(pageVBoxLayoutEnabled);

    if (!d->startSetByUser && d->pageMap.constBegin().key() == theid)
        d->start = theid;
    emit pageAdded(theid);
}